

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_service_impl::worker_entry(asio_service_impl *this)

{
  bool bVar1;
  __int_type_conflict4 _Var2;
  int iVar3;
  pthread_t __target_thread;
  char *__name;
  __int_type _Var4;
  element_type *peVar5;
  uint *puVar6;
  long in_RDI;
  exception *ee;
  size_t MAX_COUNT;
  string thread_name;
  uint32_t worker_id;
  memory_order __b_4;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  memory_order __b_2;
  uint in_stack_fffffffffffffd7c;
  function<void_(unsigned_int)> *in_stack_fffffffffffffd80;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  uint in_stack_fffffffffffffdac;
  timer_helper *in_stack_fffffffffffffdc8;
  string local_1a8 [32];
  string local_188 [72];
  undefined8 local_140;
  string local_128 [32];
  string local_108 [36];
  int local_e4;
  int local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  int *local_c8;
  int local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  int *local_b0;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  int *local_80;
  uint local_74;
  memory_order local_70;
  int local_6c;
  uint *local_68;
  __atomic_base<unsigned_long> local_48;
  memory_order local_40;
  undefined4 local_3c;
  atomic<unsigned_long> *local_38;
  
  local_b0 = (int *)(in_RDI + 0x14c);
  local_b4 = 1;
  local_b8 = 5;
  local_bc = 1;
  LOCK();
  local_e4 = *local_b0;
  *local_b0 = *local_b0 + 1;
  UNLOCK();
  local_c0 = local_e4;
  std::__cxx11::to_string(in_stack_fffffffffffffdac);
  std::operator+((char *)in_stack_fffffffffffffd88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_128);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  bVar1 = std::function::operator_cast_to_bool((function<void_(unsigned_int)> *)0x1b5c42);
  if (bVar1) {
    std::function<void_(unsigned_int)>::operator()
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  }
  if ((worker_entry()::timer == '\0') &&
     (iVar3 = __cxa_guard_acquire(&worker_entry()::timer), iVar3 != 0)) {
    timer_helper::timer_helper
              ((timer_helper *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (size_t)in_stack_fffffffffffffd88,SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
    __cxa_guard_release(&worker_entry()::timer);
  }
  local_140 = 10;
  do {
    local_c8 = (int *)(in_RDI + 0x148);
    local_cc = 1;
    local_d0 = 5;
    local_d4 = 1;
    LOCK();
    local_d8 = *local_c8;
    *local_c8 = *local_c8 + 1;
    UNLOCK();
    asio::io_context::run
              ((io_context *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_80 = (int *)(in_RDI + 0x148);
    local_84 = 1;
    local_88 = 5;
    local_8c = 1;
    LOCK();
    local_90 = *local_80;
    *local_80 = *local_80 + -1;
    UNLOCK();
    bVar1 = timer_helper::timeout_and_reset(in_stack_fffffffffffffdc8);
    if (bVar1) {
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (__int_type)in_stack_fffffffffffffd88);
    }
    else {
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffd88);
      if (10 < _Var4) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x338));
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b6427);
          iVar3 = (*peVar5->_vptr_logger[7])();
          if (0 < iVar3) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1b645a);
            local_38 = &worker_entry::exception_count;
            local_3c = 5;
            local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            local_48 = worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i;
            msg_if_given_abi_cxx11_
                      ((char *)local_188,"too many exceptions (%zu) in 1-min time window.",
                       worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i);
            (*peVar5->_vptr_logger[8])
                      (peVar5,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                       ,"worker_entry",0x719,local_188);
            std::__cxx11::string::~string(local_188);
          }
        }
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (__int_type)in_stack_fffffffffffffd88);
        abort();
      }
    }
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_char
                      ((__atomic_base<unsigned_char> *)in_stack_fffffffffffffd88);
  } while (_Var2 != '\x01');
  bVar1 = std::function::operator_cast_to_bool((function<void_(unsigned_int)> *)0x1b65c8);
  if (bVar1) {
    std::function<void_(unsigned_int)>::operator()
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x338));
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b661e);
    iVar3 = (*peVar5->_vptr_logger[7])();
    if (3 < iVar3) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6651);
      puVar6 = (uint *)(in_RDI + 0x148);
      local_6c = 5;
      local_68 = puVar6;
      local_70 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_6c - 1U < 2) {
        local_74 = *puVar6;
      }
      else if (local_6c == 5) {
        local_74 = *puVar6;
      }
      else {
        local_74 = *puVar6;
      }
      msg_if_given_abi_cxx11_
                ((char *)local_1a8,"end of asio worker thread, remaining threads: %u",
                 (ulong)local_74);
      (*peVar5->_vptr_logger[8])
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"worker_entry",0x725,local_1a8);
      std::__cxx11::string::~string(local_1a8);
    }
  }
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void asio_service_impl::worker_entry() {
    uint32_t worker_id = worker_id_.fetch_add(1);
    std::string thread_name = "nuraft_w_" + std::to_string(worker_id);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    if (my_opt_.worker_start_) {
        my_opt_.worker_start_(worker_id);
    }

    static std::atomic<size_t> exception_count(0);
    static timer_helper timer(60 * 1000000); // 1 min.
    const size_t MAX_COUNT = 10;

    do {
        try {
            num_active_workers_.fetch_add(1);
            io_svc_.run();
            num_active_workers_.fetch_sub(1);

        } catch (std::exception& ee) {
            // LCOV_EXCL_START
            num_active_workers_.fetch_sub(1);
            exception_count++;
            p_er("asio worker thread got exception: %s, "
                 "current number of workers: %u, "
                 "exception count (in 1-min window): %zu, "
                 "stopping status %u",
                 ee.what(),
                 num_active_workers_.load(),
                 exception_count.load(),
                 stopping_status_.load());
            // LCOV_EXCL_STOP
        }

        // LCOV_EXCL_START
        if (timer.timeout_and_reset()) {
            exception_count = 0;

        } else if (exception_count > MAX_COUNT) {
            p_ft("too many exceptions (%zu) in 1-min time window.",
                 exception_count.load());
            exception_count = 0;
            abort();
        }
        // LCOV_EXCL_STOP
    } while (stopping_status_ != 1);

    if (my_opt_.worker_stop_) {
        my_opt_.worker_stop_(worker_id);
    }

    p_in("end of asio worker thread, remaining threads: %u",
         num_active_workers_.load());
}